

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::verifyXFBData
          (FunctionalTest18_19 *this,GLvoid *data,GLuint bool_operator1_subroutine_location,
          GLuint bool_operator2_subroutine_location,GLuint vec4_operator1_subroutine_location,
          GLuint vec4_operator2_subroutine_location)

{
  GLuint GVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  code *pcVar7;
  ulong uVar8;
  code *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_228;
  undefined8 local_224;
  float local_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  float local_1d8;
  undefined8 local_1d4;
  float local_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b0 [8];
  float local_1a8;
  float local_1a4;
  ios_base local_138 [264];
  
  pcVar7 = vec4operator_mul4;
  pcVar9 = vec4operator_mul4;
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator1_subroutine_location) {
    pcVar9 = vec4operator_div2;
  }
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator2_subroutine_location) {
    pcVar7 = vec4operator_div2;
  }
  if (this->m_n_points_to_draw != 0) {
    GVar1 = this->m_po_subroutine_returns_true_location;
    local_1e0 = (ulong)bool_operator1_subroutine_location;
    local_1e8 = (ulong)bool_operator2_subroutine_location;
    local_1f0 = (ulong)vec4_operator1_subroutine_location;
    local_1f8 = (ulong)vec4_operator2_subroutine_location;
    uVar8 = 0;
    iVar6 = 0;
    do {
      if (GVar1 == bool_operator1_subroutine_location) {
        fVar13 = 0.0;
        fVar14 = 0.0;
        fVar15 = 0.0;
        local_1c8 = (float)((int)uVar8 * 6 + 2);
        do {
          local_1c8 = local_1c8 / (float)((int)uVar8 + 2);
        } while (1.0 < local_1c8);
      }
      else {
        fVar10 = (float)(uVar8 & 0xffffffff);
        fVar11 = fVar10 + 1.0;
        fVar13 = fVar10 + 2.0;
        fVar14 = fVar10 + 0.0;
        fVar15 = fVar10 + 0.0;
        fVar12 = fVar10 + 3.0;
        if ((uVar8 & 1) == 0) {
          if (uVar8 != 0 && GVar1 == bool_operator2_subroutine_location) {
            uVar5 = 1;
            do {
              local_228 = fVar10;
              local_224 = CONCAT44(fVar13,fVar11);
              local_21c = fVar12;
              (*pcVar9)(local_208,&local_228);
              (*pcVar7)(local_1b0,local_208);
              bVar3 = uVar5 < uVar8;
              uVar5 = (ulong)((int)uVar5 + 1);
              fVar12 = local_1a4;
              fVar11 = (float)local_1b0._4_4_;
              fVar13 = local_1a8;
              fVar10 = (float)local_1b0._0_4_;
            } while (bVar3);
            goto LAB_0097ba36;
          }
        }
        else {
          iVar4 = iVar6;
          if ((uVar8 & 0x7fffffff) != 0) {
            do {
              local_1d8 = fVar10;
              local_1d4 = CONCAT44(fVar13,fVar11);
              local_1cc = fVar12;
              (*pcVar7)(local_218,&local_1d8);
              (*pcVar9)(local_1b0,local_218);
              iVar4 = iVar4 + -1;
              fVar12 = local_1a4;
              fVar11 = (float)local_1b0._4_4_;
              fVar13 = local_1a8;
              fVar10 = (float)local_1b0._0_4_;
            } while (iVar4 != 0);
LAB_0097ba36:
            fVar15 = 0.0;
            fVar14 = 0.0;
            fVar12 = local_1a4;
            fVar11 = (float)local_1b0._4_4_;
            fVar13 = local_1a8;
            fVar10 = (float)local_1b0._0_4_;
          }
        }
        local_1c8 = fVar11 + fVar10 + fVar13 + fVar12;
      }
      fVar11 = local_1c8 - *data;
      fVar12 = -fVar11;
      if (-fVar11 <= fVar11) {
        fVar12 = fVar11;
      }
      fStack_1c4 = fVar13;
      fStack_1c0 = fVar14;
      fStack_1bc = fVar15;
      if (1e-05 < fVar12) {
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_1b0._0_4_ = SUB84(pTVar2,0);
        local_1b0._4_4_ = (undefined4)((ulong)pTVar2 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"XFBed data was found to be invalid at index [",0x2d);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "]for the following subroutine location configuration: bool_operator1_subroutine_location:["
                   ,0x5a);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] bool_operator2_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] vec4_operator1_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] vec4_operator2_subroutine_location:[",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"]; expected data:",0x11);
        std::ostream::_M_insert<double>((double)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", found:",8);
        std::ostream::_M_insert<double>((double)*data);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      data = (GLvoid *)((long)data + 4);
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + 2;
    } while (uVar8 < this->m_n_points_to_draw);
  }
  return;
}

Assistant:

void FunctionalTest18_19::verifyXFBData(const glw::GLvoid* data, glw::GLuint bool_operator1_subroutine_location,
										glw::GLuint bool_operator2_subroutine_location,
										glw::GLuint vec4_operator1_subroutine_location,
										glw::GLuint vec4_operator2_subroutine_location)
{
	bool				bool_operator1_result = false;
	bool				bool_operator2_result = false;
	const float			epsilon				  = 1e-5f;
	PFNVEC4OPERATORPROC pVec4Operator1		  = NULL;
	PFNVEC4OPERATORPROC pVec4Operator2		  = NULL;
	const glw::GLfloat* traveller_ptr		  = (const glw::GLfloat*)data;

	bool_operator1_result = (bool_operator1_subroutine_location == m_po_subroutine_returns_true_location);
	bool_operator2_result = (bool_operator2_subroutine_location == m_po_subroutine_returns_true_location);
	pVec4Operator1		  = (vec4_operator1_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;
	pVec4Operator2 = (vec4_operator2_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;

	for (unsigned int n_vertex = 0; n_vertex < m_n_points_to_draw; ++n_vertex)
	{
		float expected_value = 0.0f;

		if (bool_operator1_result)
		{
			float value = float((3 * n_vertex + 1) * 2);

			while (bool_operator1_result)
			{
				value /= float(n_vertex + 2);

				if (value <= 1.0f)
					break;
			}

			expected_value = value;
		}
		else
		{
			tcu::Vec4 value((float)n_vertex, (float)n_vertex + 1, (float)n_vertex + 2, (float)n_vertex + 3);

			switch (n_vertex % 2)
			{
			case 0:
			{
				for (unsigned int iteration = 0; iteration < n_vertex && bool_operator2_result; ++iteration)
				{
					value = pVec4Operator2(pVec4Operator1(value));
				}

				break;
			}

			case 1:
			{
				for (unsigned int iteration = 0; iteration < n_vertex * 2; ++iteration)
				{
					value = pVec4Operator1(pVec4Operator2(value));
				}

				break;
			}
			} /* switch (n_vertex % 2) */

			expected_value = value.x() + value.y() + value.z() + value.w();
		}

		if (de::abs(expected_value - *traveller_ptr) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data was found to be invalid at index [" << n_vertex
							   << "]"
								  "for the following subroutine location configuration:"
								  " bool_operator1_subroutine_location:["
							   << bool_operator1_subroutine_location << "]"
																		" bool_operator2_subroutine_location:["
							   << bool_operator2_subroutine_location << "]"
																		" vec4_operator1_subroutine_location:["
							   << vec4_operator1_subroutine_location << "]"
																		" vec4_operator2_subroutine_location:["
							   << vec4_operator2_subroutine_location << "];"
																		" expected data:"
							   << expected_value << ", found:" << *traveller_ptr << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		++traveller_ptr;
	} /* for (all drawn points) */
}